

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::ConsoleReporter::getDoubleDashes_abi_cxx11_(void)

{
  int iVar1;
  allocator local_9;
  
  if (getDoubleDashes[abi:cxx11]()::doubleDashes_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getDoubleDashes[abi:cxx11]()::doubleDashes_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)getDoubleDashes[abi:cxx11]()::doubleDashes_abi_cxx11_,0x4f,'=',&local_9);
      std::allocator<char>::~allocator((allocator<char> *)&local_9);
      __cxa_atexit(std::__cxx11::string::~string,
                   getDoubleDashes[abi:cxx11]()::doubleDashes_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&getDoubleDashes[abi:cxx11]()::doubleDashes_abi_cxx11_);
    }
  }
  return (string *)getDoubleDashes[abi:cxx11]()::doubleDashes_abi_cxx11_;
}

Assistant:

static std::string const& getDoubleDashes() {
            static const std::string doubleDashes( CATCH_CONFIG_CONSOLE_WIDTH-1, '=' );
            return doubleDashes;
        }